

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O0

int poptReadFile(char *fn,char **bp,size_t *nbp,int flags)

{
  int iVar1;
  int iVar2;
  __off_t _Var3;
  char *pcVar4;
  int *piVar5;
  int local_54;
  int oerrno;
  int rc;
  char *se;
  char *t;
  char *s;
  off_t nb;
  char *b;
  int fdno;
  int flags_local;
  size_t *nbp_local;
  char **bp_local;
  char *fn_local;
  
  nb = 0;
  s = (char *)0x0;
  local_54 = -0x10;
  iVar2 = open(fn,0);
  if (-1 < iVar2) {
    s = (char *)lseek(iVar2,0,2);
    if ((((s == (char *)0xffffffffffffffff) || (s == (char *)0xffffffffffffffff)) ||
        (_Var3 = lseek(iVar2,0,0), _Var3 == -1)) ||
       ((nb = (off_t)calloc(1,(size_t)(s + 1)), (char *)nb == (char *)0x0 ||
        (pcVar4 = (char *)read(iVar2,(void *)nb,(size_t)s), pcVar4 != s)))) {
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      close(iVar2);
      if ((s == (char *)0xffffffffffffffff) || (s != (char *)0xffffffffffffffff)) {
        piVar5 = __errno_location();
        *piVar5 = iVar1;
      }
      else {
        piVar5 = __errno_location();
        *piVar5 = -0x4b;
      }
    }
    else {
      iVar2 = close(iVar2);
      if (iVar2 != -1) {
        if ((char *)nb == (char *)0x0) {
          local_54 = -0x15;
        }
        else {
          local_54 = 0;
          if ((flags & 1U) != 0) {
            se = (char *)nb;
            for (t = (char *)nb; *t != '\0' && t < (char *)(nb + (long)s); t = t + 1) {
              if ((*t == '\\') && (t[1] == '\n')) {
                t = t + 1;
              }
              else {
                *se = *t;
                se = se + 1;
              }
            }
            *se = '\0';
            s = se + (1 - nb);
          }
        }
      }
    }
  }
  if (local_54 != 0) {
    if (nb != 0) {
      free((void *)nb);
    }
    nb = 0;
    s = (char *)0x0;
  }
  if (bp == (char **)0x0) {
    if (nb != 0) {
      free((void *)nb);
    }
  }
  else {
    *bp = (char *)nb;
  }
  if (nbp != (size_t *)0x0) {
    *nbp = (size_t)s;
  }
  return local_54;
}

Assistant:

int poptReadFile(const char * fn, char ** bp, size_t * nbp, int flags)
{
    int fdno;
    char * b = NULL;
    off_t nb = 0;
    char * s, * t, * se;
    int rc = POPT_ERROR_ERRNO;	/* assume failure */

    fdno = open(fn, O_RDONLY);
    if (fdno < 0)
	goto exit;

    if ((nb = lseek(fdno, 0, SEEK_END)) == (off_t)-1
     || (uintmax_t)nb >= SIZE_MAX
     || lseek(fdno, 0, SEEK_SET) == (off_t)-1
     || (b = calloc(sizeof(*b), (size_t)nb + 1)) == NULL
     || read(fdno, (char *)b, (size_t)nb) != (ssize_t)nb)
    {
	int oerrno = errno;
	(void) close(fdno);
	if (nb != (off_t)-1 && (uintmax_t)nb >= SIZE_MAX)
	    errno = -EOVERFLOW;
	else
	    errno = oerrno;
	goto exit;
    }
    if (close(fdno) == -1)
	goto exit;
    if (b == NULL) {
	rc = POPT_ERROR_MALLOC;
	goto exit;
    }
    rc = 0;

   /* Trim out escaped newlines. */
    if (flags & POPT_READFILE_TRIMNEWLINES)
    {
	for (t = b, s = b, se = b + nb; *s && s < se; s++) {
	    switch (*s) {
	    case '\\':
		if (s[1] == '\n') {
		    s++;
		    continue;
		}
		/* fallthrough */
	    default:
		*t++ = *s;
		break;
	    }
	}
	*t++ = '\0';
	nb = (off_t)(t - b);
    }

exit:
    if (rc != 0) {
	if (b)
	    free(b);
	b = NULL;
	nb = 0;
    }
    if (bp)
	*bp = b;
    else if (b)
	free(b);
    if (nbp)
	*nbp = (size_t)nb;
    return rc;
}